

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerNode::clearReq(TimerNode *this)

{
  TimerNode *this_local;
  
  std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
  setDeleted(this);
  return;
}

Assistant:

void TimerNode::clearReq() {
  SPHttpData.reset();
  this->setDeleted();
}